

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O1

void __thiscall JUnitTestOutput::~JUnitTestOutput(JUnitTestOutput *this)

{
  ~JUnitTestOutput(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

JUnitTestOutput::~JUnitTestOutput()
{
    resetTestGroupResult();
    delete impl_;
}